

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int i_1;
  ulong uVar7;
  int i;
  ulong uVar8;
  void *pvVar9;
  float fVar10;
  
  switch(this->op_type) {
  case 0:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = *(float *)((long)pvVar9 + uVar7 * 4) + fVar1;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 1:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = *(float *)((long)pvVar9 + uVar7 * 4) - fVar1;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 2:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = *(float *)((long)pvVar9 + uVar7 * 4) * fVar1;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 3:
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    fVar1 = this->b;
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = *(float *)((long)pvVar9 + uVar7 * 4) * (1.0 / fVar1);
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 4:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = *(float *)((long)pvVar9 + uVar7 * 4);
        if (fVar10 <= fVar1) {
          fVar10 = fVar1;
        }
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 5:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = *(float *)((long)pvVar9 + uVar7 * 4);
        if (fVar1 <= fVar10) {
          fVar10 = fVar1;
        }
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 6:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = powf(*(float *)((long)pvVar9 + uVar7 * 4),fVar1);
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 7:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar1 - *(float *)((long)pvVar9 + uVar7 * 4);
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 8:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar1 / *(float *)((long)pvVar9 + uVar7 * 4);
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 9:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = powf(fVar1,*(float *)((long)pvVar9 + uVar7 * 4));
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 10:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = atan2f(*(float *)((long)pvVar9 + uVar7 * 4),fVar1);
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
    break;
  case 0xb:
    fVar1 = this->b;
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    uVar8 = 0;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar4 = uVar8;
    }
    pvVar9 = bottom_top_blob->data;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar8;
    }
    for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        fVar10 = atan2f(fVar1,*(float *)((long)pvVar9 + uVar7 * 4));
        *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
      }
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ADD) return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);
    if (op_type == Operation_SUB) return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);
    if (op_type == Operation_MUL) return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);
    if (op_type == Operation_DIV) return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);
    if (op_type == Operation_MAX) return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);
    if (op_type == Operation_MIN) return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);
    if (op_type == Operation_POW) return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);
    if (op_type == Operation_RSUB) return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);
    if (op_type == Operation_RDIV) return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);
    if (op_type == Operation_RPOW) return binary_op_scalar_inplace<binary_op_rpow>(bottom_top_blob, b, opt);
    if (op_type == Operation_ATAN2) return binary_op_scalar_inplace<binary_op_atan2>(bottom_top_blob, b, opt);
    if (op_type == Operation_RATAN2) return binary_op_scalar_inplace<binary_op_ratan2>(bottom_top_blob, b, opt);

    // should nerver reach here
    return 0;
}